

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicsSpecsBaseOf.hpp
# Opt level: O3

void __thiscall
sciplot::TicsSpecsBaseOf<sciplot::TicsSpecsMajor>::TicsSpecsBaseOf
          (TicsSpecsBaseOf<sciplot::TicsSpecsMajor> *this,void **vtt)

{
  void *pvVar1;
  
  TextSpecsOf<sciplot::TicsSpecsMajor>::TextSpecsOf
            (&this->super_TextSpecsOf<sciplot::TicsSpecsMajor>,vtt + 1);
  OffsetSpecsOf<sciplot::TicsSpecsMajor>::OffsetSpecsOf
            (&this->super_OffsetSpecsOf<sciplot::TicsSpecsMajor>,vtt + 5);
  pvVar1 = vtt[7];
  *(void **)&this->super_ShowSpecsOf<sciplot::TicsSpecsMajor> = pvVar1;
  *(void **)(&(this->super_ShowSpecsOf<sciplot::TicsSpecsMajor>).field_0x0 +
            *(long *)((long)pvVar1 + -0x28)) = vtt[8];
  (this->super_ShowSpecsOf<sciplot::TicsSpecsMajor>).m_show = true;
  pvVar1 = *vtt;
  *(void **)&(this->super_TextSpecsOf<sciplot::TicsSpecsMajor>).
             super_FontSpecsOf<sciplot::TicsSpecsMajor> = pvVar1;
  *(void **)(&(this->super_TextSpecsOf<sciplot::TicsSpecsMajor>).
              super_FontSpecsOf<sciplot::TicsSpecsMajor>.field_0x0 + *(long *)((long)pvVar1 + -0x28)
            ) = vtt[9];
  *(void **)&this->super_OffsetSpecsOf<sciplot::TicsSpecsMajor> = vtt[10];
  *(void **)&this->super_ShowSpecsOf<sciplot::TicsSpecsMajor> = vtt[0xb];
  (this->m_along)._M_dataplus._M_p = (pointer)&(this->m_along).field_2;
  (this->m_along)._M_string_length = 0;
  (this->m_along).field_2._M_local_buf[0] = '\0';
  (this->m_mirror)._M_dataplus._M_p = (pointer)&(this->m_mirror).field_2;
  (this->m_mirror)._M_string_length = 0;
  (this->m_mirror).field_2._M_local_buf[0] = '\0';
  (this->m_rotate)._M_dataplus._M_p = (pointer)&(this->m_rotate).field_2;
  (this->m_rotate)._M_string_length = 0;
  (this->m_rotate).field_2._M_local_buf[0] = '\0';
  (this->m_inout)._M_dataplus._M_p = (pointer)&(this->m_inout).field_2;
  (this->m_inout)._M_string_length = 0;
  (this->m_inout).field_2._M_local_buf[0] = '\0';
  (this->m_format)._M_dataplus._M_p = (pointer)&(this->m_format).field_2;
  (this->m_format)._M_string_length = 0;
  (this->m_format).field_2._M_local_buf[0] = '\0';
  this->m_scalemajor = 1.0;
  this->m_scaleminor = 1.0;
  std::__cxx11::string::_M_replace((ulong)&this->m_along,0,(char *)0x0,0x18c117);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_mirror,0,(char *)(this->m_mirror)._M_string_length,0x18d52c);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_inout,0,(char *)(this->m_inout)._M_string_length,0x18d535);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_rotate,0,(char *)(this->m_rotate)._M_string_length,0x18d539);
  this->m_scalemajor = 0.5;
  this->m_scaleminor = 0.25;
  return;
}

Assistant:

TicsSpecsBaseOf<DerivedSpecs>::TicsSpecsBaseOf()
{
    alongBorder();
    mirror(internal::DEFAULT_TICS_MIRROR);
    outsideGraph();
    rotate(internal::DEFAULT_TICS_ROTATE);
    scaleMajorBy(internal::DEFAULT_TICS_SCALE_MAJOR_BY);
    scaleMinorBy(internal::DEFAULT_TICS_SCALE_MINOR_BY);
}